

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FArchive * operator<<(FArchive *arc,FState **state)

{
  PClassActor *pPVar1;
  FState *pFVar2;
  DWORD DVar3;
  ulong uVar4;
  PClass *myclass;
  PClass *local_20;
  
  if (arc->m_Storing == true) {
    pFVar2 = *state;
    if (pFVar2 == (FState *)0x0) {
      FArchive::UserWriteClass(arc,AActor::RegistrationInfo.MyClass);
      DVar3 = 0x7f;
LAB_0057174a:
      FArchive::WriteCount(arc,DVar3);
    }
    else if ((ulong)PClassActor::AllActorClasses.Count != 0) {
      uVar4 = 0;
      do {
        pPVar1 = PClassActor::AllActorClasses.Array[uVar4];
        if ((pPVar1->OwnedStates <= pFVar2) &&
           (pFVar2 < pPVar1->OwnedStates + pPVar1->NumOwnedStates)) {
          FArchive::UserWriteClass(arc,&pPVar1->super_PClass);
          DVar3 = (int)((ulong)((long)*state - (long)pPVar1->OwnedStates) >> 3) * -0x33333333;
          goto LAB_0057174a;
        }
        uVar4 = uVar4 + 1;
      } while (PClassActor::AllActorClasses.Count != uVar4);
    }
  }
  else {
    FArchive::UserReadClass(arc,&local_20);
    pPVar1 = dyn_cast<PClassActor>((DObject *)local_20);
    DVar3 = FArchive::ReadCount(arc);
    if ((DVar3 == 0x7f) && (pPVar1 == (PClassActor *)AActor::RegistrationInfo.MyClass)) {
      pFVar2 = (FState *)0x0;
    }
    else {
      pFVar2 = pPVar1->OwnedStates + DVar3;
    }
    *state = pFVar2;
  }
  return arc;
}

Assistant:

FArchive &operator<< (FArchive &arc, FState *&state)
{
	PClassActor *info;

	if (arc.IsStoring ())
	{
		if (state == NULL)
		{
			arc.UserWriteClass (RUNTIME_CLASS(AActor));
			arc.WriteCount (NULL_STATE_INDEX);
			return arc;
		}

		info = FState::StaticFindStateOwner (state);

		if (info != NULL)
		{
			arc.UserWriteClass (info);
			arc.WriteCount ((DWORD)(state - info->OwnedStates));
		}
		else
		{
			/* this was never working as intended.
			I_Error ("Cannot find owner for state %p:\n"
					 "%s %c%c %3d [%p] -> %p", state,
					 sprites[state->sprite].name,
					 state->GetFrame() + 'A',
					 state->GetFullbright() ? '*' : ' ',
					 state->GetTics(),
					 state->GetAction(),
					 state->GetNextState());
			*/
		}
	}
	else
	{
		PClassActor *info;
		DWORD ofs;

		arc.UserReadClass<PClassActor>(info);
		ofs = arc.ReadCount ();
		if (ofs == NULL_STATE_INDEX && info == RUNTIME_CLASS(AActor))
		{
			state = NULL;
		}
		else
		{
			state = info->OwnedStates + ofs;
		}
	}
	return arc;
}